

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O2

void __thiscall pg::DTLSolver::DTLSolver(DTLSolver *this,Oink *oink,Game *game)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [64];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  bitset bVar5;
  
  Solver::Solver(&this->super_Solver,oink,game);
  auVar4 = ZEXT816(0) << 0x40;
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__DTLSolver_0019dbc0;
  this->interleaved = false;
  (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->SQ).pointer = 0;
  (this->SQ).queue = (uint *)0x0;
  (this->pea_iS).pointer = 0;
  (this->pea_iS).queue = (uint *)0x0;
  (this->pea_S).pointer = 0;
  (this->pea_S).queue = (uint *)0x0;
  bVar5 = (bitset)ZEXT1632(auVar4);
  this->pea_root = bVar5;
  this->iterations = 0;
  this->dominions = 0;
  this->tangles = 0;
  this->steps = 0;
  (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)bVar5._bits;
  (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)bVar5._size;
  (this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)bVar5._bitssize;
  (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)bVar5._allocsize;
  bVar5 = (bitset)ZEXT1632(auVar4);
  *(bitset *)
   ((long)&(this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start + 4) = bVar5;
  (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)bVar5._bits;
  (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)bVar5._size;
  (this->dom_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)bVar5._bitssize;
  (this->Zvec).queue = (uint *)bVar5._allocsize;
  (this->Zvec).pointer = 0;
  this->regflag = bVar5;
  *(bitset *)((long)&(this->regflag)._size + 4) = bVar5;
  (this->tangleto).pointer = 0;
  auVar2 = ZEXT464(0) << 0x40;
  this->tangle = (vector<int,_std::allocator<int>_>)SUB3224(ZEXT1632(auVar4),0);
  (this->tangleto).queue = (uint *)SUB328(ZEXT1632(auVar4),0x18);
  auVar1 = auVar2._0_32_;
  auVar3 = auVar2._32_32_;
  (this->W)._bits = (uint64_t *)auVar1._0_8_;
  (this->W)._size = auVar1._8_8_;
  (this->W)._bitssize = auVar1._16_8_;
  (this->W)._allocsize = auVar1._24_8_;
  (this->Player)._bits = (uint64_t *)auVar3._0_8_;
  (this->Player)._size = auVar3._8_8_;
  (this->Player)._bitssize = auVar3._16_8_;
  (this->Player)._allocsize = auVar3._24_8_;
  auVar1 = auVar2._0_32_;
  auVar3 = auVar2._32_32_;
  (this->G)._bits = (uint64_t *)auVar1._0_8_;
  (this->G)._size = auVar1._8_8_;
  (this->G)._bitssize = auVar1._16_8_;
  (this->G)._allocsize = auVar1._24_8_;
  (this->S)._bits = (uint64_t *)auVar3._0_8_;
  (this->S)._size = auVar3._8_8_;
  (this->S)._bitssize = auVar3._16_8_;
  (this->S)._allocsize = auVar3._24_8_;
  auVar1 = auVar2._0_32_;
  auVar3 = auVar2._32_32_;
  (this->escapes)._bits = (uint64_t *)auVar1._0_8_;
  (this->escapes)._size = auVar1._8_8_;
  (this->escapes)._bitssize = auVar1._16_8_;
  (this->escapes)._allocsize = auVar1._24_8_;
  (this->Z)._bits = (uint64_t *)auVar3._0_8_;
  (this->Z)._size = auVar3._8_8_;
  (this->Z)._bitssize = auVar3._16_8_;
  (this->Z)._allocsize = auVar3._24_8_;
  return;
}

Assistant:

DTLSolver::DTLSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}